

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeNF
          (ChElementHexaCorot_8 *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  *detJ = this->Volume * 0.125;
  lVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar1) {
    lVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < lVar2) {
      dVar5 = (1.0 - U) * 0.125;
      dVar6 = (1.0 - V) * dVar5;
      dVar10 = 1.0 - W;
      dVar7 = dVar6 * dVar10;
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      *pdVar4 = dVar7 * *pdVar3;
      if (lVar1 == 1) goto LAB_006c98ab;
      if (lVar2 != 1) {
        pdVar4[1] = dVar7 * pdVar3[1];
        if (lVar1 < 3) goto LAB_006c98ab;
        if ((2 < lVar2) && (pdVar4[2] = dVar7 * pdVar3[2], lVar2 != 3)) {
          dVar8 = (U + 1.0) * 0.125;
          dVar9 = (1.0 - V) * dVar8;
          dVar7 = dVar9 * dVar10;
          pdVar4[3] = dVar7 * *pdVar3;
          if ((4 < lVar2) &&
             ((pdVar4[4] = dVar7 * pdVar3[1], lVar2 != 5 &&
              (pdVar4[5] = dVar7 * pdVar3[2], 6 < lVar2)))) {
            dVar8 = (V + 1.0) * dVar8;
            dVar7 = dVar8 * dVar10;
            pdVar4[6] = dVar7 * *pdVar3;
            if ((lVar2 != 7) &&
               ((pdVar4[7] = dVar7 * pdVar3[1], 8 < lVar2 &&
                (pdVar4[8] = dVar7 * pdVar3[2], lVar2 != 9)))) {
              dVar5 = (V + 1.0) * dVar5;
              dVar10 = dVar5 * dVar10;
              pdVar4[9] = dVar10 * *pdVar3;
              if ((10 < lVar2) &&
                 ((pdVar4[10] = dVar10 * pdVar3[1], lVar2 != 0xb &&
                  (pdVar4[0xb] = dVar10 * pdVar3[2], 0xc < lVar2)))) {
                dVar7 = W + 1.0;
                dVar6 = dVar6 * dVar7;
                pdVar4[0xc] = dVar6 * *pdVar3;
                if ((lVar2 != 0xd) &&
                   ((pdVar4[0xd] = dVar6 * pdVar3[1], 0xe < lVar2 &&
                    (pdVar4[0xe] = dVar6 * pdVar3[2], lVar2 != 0xf)))) {
                  dVar9 = dVar9 * dVar7;
                  pdVar4[0xf] = dVar9 * *pdVar3;
                  if ((0x10 < lVar2) &&
                     ((pdVar4[0x10] = dVar9 * pdVar3[1], lVar2 != 0x11 &&
                      (pdVar4[0x11] = dVar9 * pdVar3[2], 0x12 < lVar2)))) {
                    dVar8 = dVar8 * dVar7;
                    pdVar4[0x12] = dVar8 * *pdVar3;
                    if ((lVar2 != 0x13) &&
                       ((pdVar4[0x13] = dVar8 * pdVar3[1], 0x14 < lVar2 &&
                        (pdVar4[0x14] = dVar8 * pdVar3[2], lVar2 != 0x15)))) {
                      dVar5 = dVar5 * dVar7;
                      pdVar4[0x15] = dVar5 * *pdVar3;
                      if ((0x16 < lVar2) && (pdVar4[0x16] = dVar5 * pdVar3[1], lVar2 != 0x17)) {
                        pdVar4[0x17] = dVar5 * pdVar3[2];
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_006c98ab:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChElementHexaCorot_8::ComputeNF(const double U,
                                     const double V,
                                     const double W,
                                     ChVectorDynamic<>& Qi,
                                     double& detJ,
                                     const ChVectorDynamic<>& F,
                                     ChVectorDynamic<>* state_x,
                                     ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependant on state
    ShapeVector N;
    ShapeFunctions(N, U, V, W);  // note: U,V,W in -1..1 range

    detJ = this->GetVolume() / 8.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
    Qi(12) = N(4) * F(0);
    Qi(13) = N(4) * F(1);
    Qi(14) = N(4) * F(2);
    Qi(15) = N(5) * F(0);
    Qi(16) = N(5) * F(1);
    Qi(17) = N(5) * F(2);
    Qi(18) = N(6) * F(0);
    Qi(19) = N(6) * F(1);
    Qi(20) = N(6) * F(2);
    Qi(21) = N(7) * F(0);
    Qi(22) = N(7) * F(1);
    Qi(23) = N(7) * F(2);
}